

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.h
# Opt level: O0

cmCommand * __thiscall cmSetDirectoryPropertiesCommand::Clone(cmSetDirectoryPropertiesCommand *this)

{
  cmCommand *this_00;
  cmSetDirectoryPropertiesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSetDirectoryPropertiesCommand((cmSetDirectoryPropertiesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    return new cmSetDirectoryPropertiesCommand;
  }